

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMathCommand.cxx
# Opt level: O2

bool __thiscall
cmMathCommand::HandleExprCommand
          (cmMathCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  char *__format;
  int iVar7;
  string argument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  cmExprParserHelper helper;
  char buffer [1024];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  if ((lVar6 == 3) || (lVar6 == 5)) {
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar1 + 1,"ERROR");
    iVar7 = 0;
    if (0x60 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)buffer,"sub-command EXPR ",(allocator<char> *)&helper);
      std::__cxx11::string::string
                ((string *)&helper,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 3));
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &helper,"OUTPUT_FORMAT");
      if (bVar3) {
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x81) {
          std::operator+(&local_578,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer
                         ,"missing argument for option \"");
          std::operator+(&error,&local_578,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &helper);
          std::operator+(&argument,&error,"\".");
          std::__cxx11::string::~string((string *)&error);
          std::__cxx11::string::~string((string *)&local_578);
          cmCommand::SetError(&this->super_cmCommand,&argument);
          goto LAB_0027153a;
        }
        std::__cxx11::string::string((string *)&argument,(string *)(pbVar2 + 4));
        bVar4 = std::operator==(&argument,"DECIMAL");
        bVar3 = true;
        if (bVar4) {
          iVar7 = 1;
        }
        else {
          bVar4 = std::operator==(&argument,"HEXADECIMAL");
          if (bVar4) {
            iVar7 = 2;
          }
          else {
            std::operator+(&local_538,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           buffer,"value \"");
            std::operator+(&local_518,&local_538,&argument);
            std::operator+(&local_4f8,&local_518,"\" for option \"");
            std::operator+(&local_578,&local_4f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &helper);
            std::operator+(&error,&local_578,"\" is invalid.");
            std::__cxx11::string::~string((string *)&local_578);
            std::__cxx11::string::~string((string *)&local_4f8);
            std::__cxx11::string::~string((string *)&local_518);
            std::__cxx11::string::~string((string *)&local_538);
            cmCommand::SetError(&this->super_cmCommand,&error);
            std::__cxx11::string::~string((string *)&error);
            iVar7 = 0;
            bVar3 = false;
          }
        }
        std::__cxx11::string::~string((string *)&argument);
      }
      else {
        std::operator+(&local_578,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                       "option \"");
        std::operator+(&error,&local_578,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&helper)
        ;
        std::operator+(&argument,&error,"\" is unknown.");
        std::__cxx11::string::~string((string *)&error);
        std::__cxx11::string::~string((string *)&local_578);
        cmCommand::SetError(&this->super_cmCommand,&argument);
LAB_0027153a:
        std::__cxx11::string::~string((string *)&argument);
        iVar7 = 0;
        bVar3 = false;
      }
      std::__cxx11::string::~string((string *)&helper);
      std::__cxx11::string::~string((string *)buffer);
      if (!bVar3) goto LAB_002716df;
    }
    cmExprParserHelper::cmExprParserHelper(&helper);
    iVar5 = cmExprParserHelper::ParseString(&helper,pbVar1[2]._M_dataplus._M_p,0);
    bVar3 = iVar5 != 0;
    if (iVar5 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)buffer,helper.ErrorString._M_dataplus._M_p,(allocator<char> *)&argument);
      cmCommand::SetError(&this->super_cmCommand,(string *)buffer);
      std::__cxx11::string::~string((string *)buffer);
    }
    else {
      __format = "%ld";
      if (iVar7 == 2) {
        __format = "0x%lx";
      }
      sprintf(buffer,__format,helper.Result);
      if (helper.WarningString._M_string_length != 0) {
        cmMakefile::IssueMessage
                  ((this->super_cmCommand).Makefile,AUTHOR_WARNING,&helper.WarningString);
      }
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar1 + 1,buffer);
    }
    cmExprParserHelper::~cmExprParserHelper(&helper);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)buffer,"EXPR called with incorrect arguments.",(allocator<char> *)&helper);
    cmCommand::SetError(&this->super_cmCommand,(string *)buffer);
    std::__cxx11::string::~string((string *)buffer);
LAB_002716df:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmMathCommand::HandleExprCommand(std::vector<std::string> const& args)
{
  if ((args.size() != 3) && (args.size() != 5)) {
    this->SetError("EXPR called with incorrect arguments.");
    return false;
  }

  enum class NumericFormat
  {
    UNINITIALIZED,
    DECIMAL,
    HEXADECIMAL,
  };

  const std::string& outputVariable = args[1];
  const std::string& expression = args[2];
  size_t argumentIndex = 3;
  NumericFormat outputFormat = NumericFormat::UNINITIALIZED;

  this->Makefile->AddDefinition(outputVariable, "ERROR");

  if (argumentIndex < args.size()) {
    const std::string messageHint = "sub-command EXPR ";
    const std::string option = args[argumentIndex++];
    if (option == "OUTPUT_FORMAT") {
      if (argumentIndex < args.size()) {
        const std::string argument = args[argumentIndex++];
        if (argument == "DECIMAL") {
          outputFormat = NumericFormat::DECIMAL;
        } else if (argument == "HEXADECIMAL") {
          outputFormat = NumericFormat::HEXADECIMAL;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          this->SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        this->SetError(error);
        return false;
      }
    } else {
      std::string error =
        messageHint + "option \"" + option + "\" is unknown.";
      this->SetError(error);
      return false;
    }
  }

  if (outputFormat == NumericFormat::UNINITIALIZED) {
    outputFormat = NumericFormat::DECIMAL;
  }

  cmExprParserHelper helper;
  if (!helper.ParseString(expression.c_str(), 0)) {
    this->SetError(helper.GetError());
    return false;
  }

  char buffer[1024];
  const char* fmt;
  switch (outputFormat) {
    case NumericFormat::HEXADECIMAL:
      fmt = "0x%" KWIML_INT_PRIx64;
      break;
    case NumericFormat::DECIMAL:
      CM_FALLTHROUGH;
    default:
      fmt = "%" KWIML_INT_PRId64;
      break;
  }
  sprintf(buffer, fmt, helper.GetResult());

  std::string const& w = helper.GetWarning();
  if (!w.empty()) {
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w);
  }

  this->Makefile->AddDefinition(outputVariable, buffer);
  return true;
}